

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  BCLine hashline;
  byte *pbVar1;
  CTState *cts;
  long lVar2;
  undefined1 uVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  CTypeID CVar7;
  int iVar8;
  CPToken CVar9;
  CPscl CVar10;
  CTypeID id;
  ulong uVar11;
  long lVar12;
  CType *ct;
  CType *local_9d8;
  CPDecl decl;
  
  *(undefined4 *)((long)L->cframe + 0xc) = 0xffffffff;
  *(undefined8 *)((long)ud + 0x68) = 1;
  *(undefined1 *)((long)ud + 0x7f) = 0;
  *(undefined1 *)((long)ud + 0x78) = 0xff;
  pbVar1 = *(byte **)((long)ud + 0x20);
  *(undefined8 *)((long)ud + 0x40) = *(undefined8 *)((long)ud + 0x48);
  *(undefined8 *)((long)ud + 0x28) = 0;
  *(undefined8 *)((long)ud + 0x30) = 0;
  *(undefined8 *)((long)ud + 0x38) = 0;
  *(byte **)((long)ud + 0x20) = pbVar1 + 1;
  uVar6 = (uint)*pbVar1;
  *(uint *)ud = uVar6;
  if (uVar6 == 0x5c) {
    cp_get_bs((CPState *)ud);
  }
  *(undefined4 *)((long)ud + 4) = 0;
  *(undefined4 *)((long)ud + 0x70) = 0x38c0;
  cp_next((CPState *)ud);
  if ((*(byte *)((long)ud + 0x74) & 1) == 0) {
    cp_decl_spec((CPState *)ud,&decl,0);
    cp_declarator((CPState *)ud,&decl);
    CVar7 = cp_decl_intern((CPState *)ud,&decl);
    *(CTypeID *)((long)ud + 0xc) = CVar7;
    if (*(int *)((long)ud + 4) != 0x103) {
      cp_err_token((CPState *)ud,0x103);
    }
LAB_00142c4d:
    if ((*(long *)((long)ud + 0x58) != 0) &&
       (*(long *)((long)ud + 0x58) != *(long *)(*(long *)((long)ud + 0x48) + 0x28))) {
      cp_err((CPState *)ud,LJ_ERR_FFI_NUMPARAM);
    }
    return (TValue *)0x0;
  }
  bVar4 = true;
LAB_00142c89:
  if (*(int *)((long)ud + 4) != 0x103) {
    iVar8 = cp_opt((CPState *)ud,0x3b);
    if (iVar8 != 0) goto LAB_00142e9c;
    if (*(int *)((long)ud + 4) != 0x23) {
      CVar10 = cp_decl_spec((CPState *)ud,&decl,0x38000);
      iVar8 = *(int *)((long)ud + 4);
      if ((((iVar8 != 0x103) && (iVar8 != 0x3b)) ||
          ((decl.stack[0].info & 0xf0000000) != 0x70000000)) ||
         (((*(uint *)(**(long **)((long)ud + 0x50) + (ulong)(decl.stack[0].info & 0xffff) * 0x18) >>
           0x1c) - 1 & 0xfffffffb) != 0)) {
        do {
          cp_declarator((CPState *)ud,&decl);
          CVar7 = cp_decl_intern((CPState *)ud,&decl);
          if ((decl.name != (GCstr *)0x0) && (decl.nameid == 0)) {
            cts = *(CTState **)((long)ud + 0x50);
            if ((short)CVar10 < 0) {
              id = lj_ctype_new(cts,&ct);
              ct->info = CVar7 + 0x70000000;
            }
            else {
              if ((cts->tab[CVar7].info & 0xf0000000) == 0x60000000) {
                ct = cts->tab + CVar7;
                id = CVar7;
              }
              else {
                if ((CVar10 >> 0x11 & 1) != 0) {
                  id = cp_decl_constinit((CPState *)ud,&ct,CVar7);
                  goto LAB_00142e46;
                }
                id = lj_ctype_new(cts,&ct);
                ct->info = CVar7 + 0xc0000000;
              }
              if (decl.redir != (GCstr *)0x0) {
                CVar7 = lj_ctype_new(*(CTState **)((long)ud + 0x50),&local_9d8);
                lVar2 = **(long **)((long)ud + 0x50);
                lVar12 = (ulong)id * 0x18;
                ct = (CType *)(lVar2 + lVar12);
                local_9d8->info = 0x80040000;
                local_9d8->sib = *(CTypeID1 *)(lVar2 + 8 + lVar12);
                *(short *)(lVar2 + 8 + lVar12) = (short)CVar7;
                (decl.redir)->marked = (decl.redir)->marked | 0x20;
                (local_9d8->name).gcptr64 = (uint64_t)decl.redir;
              }
            }
LAB_00142e46:
            (decl.name)->marked = (decl.name)->marked | 0x20;
            (ct->name).gcptr64 = (uint64_t)decl.name;
            lj_ctype_addname(*(CTState **)((long)ud + 0x50),ct,id);
          }
          iVar8 = cp_opt((CPState *)ud,0x2c);
          if (iVar8 == 0) goto code_r0x00142e71;
          cp_decl_reset(&decl);
        } while( true );
      }
      goto LAB_00142e74;
    }
    hashline = *(BCLine *)((long)ud + 0x68);
    CVar9 = cp_next((CPState *)ud);
    if (CVar9 == 0x100) {
      lVar2 = *(long *)((long)ud + 0x10);
      if (*(int *)(lVar2 + 0x14) == 6) {
        iVar8 = bcmp((void *)(lVar2 + 0x18),"pragma",6);
        if (iVar8 == 0) {
          cp_next((CPState *)ud);
          iVar8 = *(int *)((long)ud + 4);
          if (((iVar8 == 0x100) && (*(int *)(*(long *)((long)ud + 0x10) + 0x14) == 4)) &&
             (*(int *)(*(long *)((long)ud + 0x10) + 0x18) == 0x6b636170)) {
            cp_next((CPState *)ud);
            cp_check((CPState *)ud,0x28);
            iVar8 = *(int *)((long)ud + 4);
            if (iVar8 == 0x100) {
              lVar2 = *(long *)((long)ud + 0x10);
              if (*(int *)(lVar2 + 0x14) == 3) {
                iVar8 = bcmp((void *)(lVar2 + 0x18),"pop",3);
                if (iVar8 != 0) goto LAB_00143063;
                if (*(char *)((long)ud + 0x7f) != '\0') {
                  cVar5 = *(char *)((long)ud + 0x7f) + -1;
                  goto LAB_00142fc5;
                }
              }
              else {
                if ((*(int *)(lVar2 + 0x14) != 4) || (*(int *)(lVar2 + 0x18) != 0x68737570)) {
LAB_00143063:
                  CVar9 = 0x100;
                  goto LAB_00143030;
                }
                uVar11 = (ulong)*(byte *)((long)ud + 0x7f);
                if (uVar11 < 7) {
                  *(undefined1 *)((long)ud + uVar11 + 0x79) =
                       *(undefined1 *)((long)ud + uVar11 + 0x78);
                  cVar5 = *(char *)((long)ud + 0x7f) + '\x01';
LAB_00142fc5:
                  *(char *)((long)ud + 0x7f) = cVar5;
                }
              }
              cp_next((CPState *)ud);
              iVar8 = cp_opt((CPState *)ud,0x2c);
              if (iVar8 != 0) {
                iVar8 = *(int *)((long)ud + 4);
                goto LAB_00142fe2;
              }
            }
            else {
LAB_00142fe2:
              if (iVar8 == 0x102) {
                uVar6 = *(uint *)((long)ud + 8);
                iVar8 = 0x1f;
                if (uVar6 != 0) {
                  for (; uVar6 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                  }
                }
                uVar3 = (undefined1)iVar8;
                if (uVar6 == 0) {
                  uVar3 = 0;
                }
                *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x7f) + 0x78) = uVar3;
                cp_next((CPState *)ud);
              }
              else {
                *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x7f) + 0x78) = 0xff;
              }
            }
            cp_check((CPState *)ud,0x29);
          }
          else {
            while ((iVar8 != 0x103 && (*(int *)((long)ud + 0x68) == hashline))) {
              cp_next((CPState *)ud);
              iVar8 = *(int *)((long)ud + 4);
            }
          }
          goto LAB_00142c89;
        }
      }
      else if ((*(int *)(lVar2 + 0x14) == 4) && (*(int *)(lVar2 + 0x18) == 0x656e696c)) {
        CVar9 = cp_next((CPState *)ud);
        if (CVar9 != 0x102) {
          cp_err_token((CPState *)ud,0x100);
        }
        goto LAB_00142ed9;
      }
    }
    else if (CVar9 == 0x102) {
LAB_00142ed9:
      cp_line((CPState *)ud,hashline);
      goto LAB_00142c89;
    }
    CVar9 = *(CPToken *)((long)ud + 4);
LAB_00143030:
    cp_errmsg((CPState *)ud,CVar9,LJ_ERR_XSYMBOL);
  }
  goto LAB_00142c4d;
code_r0x00142e71:
  iVar8 = *(int *)((long)ud + 4);
LAB_00142e74:
  if (bVar4 && iVar8 == 0x103) goto LAB_00142c4d;
  cp_check((CPState *)ud,0x3b);
LAB_00142e9c:
  bVar4 = false;
  goto LAB_00142c89;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}